

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O3

FT_Error cff_index_get_pointers(CFF_Index idx,FT_Byte ***table,FT_Byte **pool,FT_ULong *pool_size)

{
  uint *puVar1;
  ushort *puVar2;
  uint *puVar3;
  byte bVar4;
  ushort uVar5;
  FT_Memory memory;
  FT_Stream stream;
  FT_Memory memory_00;
  FT_Byte *pFVar6;
  uint uVar7;
  FT_Byte **ppFVar8;
  FT_Byte *pFVar9;
  FT_ULong *pFVar10;
  ulong *puVar11;
  FT_Byte *pFVar12;
  FT_ULong FVar13;
  uint *puVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  FT_Error local_38;
  FT_Error local_34 [2];
  FT_Error error;
  
  local_34[0] = 0;
  memory = idx->stream->memory;
  *table = (FT_Byte **)0x0;
  if (idx->offsets != (FT_ULong *)0x0) goto LAB_001fe428;
  local_38 = 0;
  if (idx->count == 0) {
LAB_001fe739:
    local_34[0] = 0;
  }
  else {
    stream = idx->stream;
    memory_00 = stream->memory;
    bVar4 = idx->off_size;
    uVar16 = (ulong)(idx->count + 1);
    pFVar10 = (FT_ULong *)ft_mem_realloc(memory_00,8,0,uVar16,(void *)0x0,&local_38);
    idx->offsets = pFVar10;
    if ((local_38 == 0) &&
       (local_38 = FT_Stream_Seek(stream,(ulong)idx->hdr_size + idx->start), local_38 == 0)) {
      FVar13 = uVar16 * bVar4;
      local_38 = FT_Stream_EnterFrame(stream,FVar13);
      if (local_38 == 0) {
        puVar11 = idx->offsets;
        puVar14 = (uint *)stream->cursor;
        puVar1 = (uint *)((long)puVar14 + FVar13);
        if (bVar4 == 1) {
          if (FVar13 != 0) {
            do {
              *puVar11 = (ulong)(byte)*puVar14;
              puVar14 = (uint *)((long)puVar14 + 1);
              puVar11 = puVar11 + 1;
            } while (puVar14 < puVar1);
          }
        }
        else if (bVar4 == 2) {
          if (FVar13 != 0) {
            lVar19 = 0;
            do {
              puVar2 = (ushort *)((long)puVar14 + lVar19);
              uVar5 = *puVar2;
              *(ulong *)((long)puVar11 + lVar19 * 4) = (ulong)(ushort)(uVar5 << 8 | uVar5 >> 8);
              lVar19 = lVar19 + 2;
            } while (puVar2 + 1 < puVar1);
          }
        }
        else if (bVar4 == 3) {
          if (FVar13 != 0) {
            do {
              *puVar11 = (ulong)*(byte *)((long)puVar14 + 2) |
                         (ulong)((uint)*(byte *)((long)puVar14 + 1) << 8 |
                                (uint)(byte)*puVar14 << 0x10);
              puVar14 = (uint *)((long)puVar14 + 3);
              puVar11 = puVar11 + 1;
            } while (puVar14 < puVar1);
          }
        }
        else if (FVar13 != 0) {
          lVar19 = 0;
          do {
            puVar3 = (uint *)((long)puVar14 + lVar19);
            uVar7 = *puVar3;
            *(ulong *)((long)puVar11 + lVar19 * 2) =
                 (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                        uVar7 << 0x18);
            lVar19 = lVar19 + 4;
          } while (puVar3 + 1 < puVar1);
        }
        FT_Stream_ExitFrame(stream);
        if (local_38 == 0) goto LAB_001fe739;
      }
    }
    ft_mem_free(memory_00,idx->offsets);
    idx->offsets = (FT_ULong *)0x0;
    local_34[0] = local_38;
    if (local_38 != 0) {
      return local_38;
    }
  }
LAB_001fe428:
  uVar7 = idx->count;
  if ((ulong)uVar7 != 0) {
    FVar13 = (ulong)uVar7 + idx->data_size;
    ppFVar8 = (FT_Byte **)ft_mem_realloc(memory,8,0,(ulong)(uVar7 + 1),(void *)0x0,local_34);
    if (local_34[0] == 0) {
      if (pool == (FT_Byte **)0x0) {
        pFVar9 = (FT_Byte *)0x0;
      }
      else {
        pFVar9 = (FT_Byte *)ft_mem_alloc(memory,FVar13,local_34);
        if (local_34[0] != 0) {
          return local_34[0];
        }
      }
      pFVar6 = idx->bytes;
      pFVar12 = pFVar9;
      if (pool == (FT_Byte **)0x0) {
        pFVar12 = pFVar6;
      }
      *ppFVar8 = pFVar12;
      uVar7 = idx->count;
      if (uVar7 != 0) {
        uVar18 = 0;
        lVar19 = 0;
        uVar16 = 0;
        do {
          uVar15 = idx->offsets[uVar18 + 1] - 1;
          uVar17 = uVar16;
          if ((uVar16 <= uVar15) && (uVar17 = idx->data_size, uVar15 < idx->data_size)) {
            uVar17 = uVar15;
          }
          if (pool == (FT_Byte **)0x0) {
            ppFVar8[uVar18 + 1] = pFVar6 + uVar17;
          }
          else {
            ppFVar8[uVar18 + 1] = pFVar9 + lVar19 + uVar17;
            if (uVar17 != uVar16) {
              memcpy(ppFVar8[uVar18],pFVar6 + uVar16,
                     (long)(pFVar9 + lVar19 + uVar17) - (long)ppFVar8[uVar18]);
              *ppFVar8[uVar18 + 1] = '\0';
              ppFVar8[uVar18 + 1] = ppFVar8[uVar18 + 1] + 1;
              lVar19 = lVar19 + 1;
              uVar7 = idx->count;
            }
          }
          uVar18 = uVar18 + 1;
          uVar16 = uVar17;
        } while (uVar18 < uVar7);
      }
      *table = ppFVar8;
      if (pool != (FT_Byte **)0x0) {
        *pool = pFVar9;
      }
      if (pool_size != (FT_ULong *)0x0) {
        *pool_size = FVar13;
      }
    }
  }
  return local_34[0];
}

Assistant:

static FT_Error
  cff_index_get_pointers( CFF_Index   idx,
                          FT_Byte***  table,
                          FT_Byte**   pool,
                          FT_ULong*   pool_size )
  {
    FT_Error   error     = FT_Err_Ok;
    FT_Memory  memory    = idx->stream->memory;

    FT_Byte**  t         = NULL;
    FT_Byte*   new_bytes = NULL;
    FT_ULong   new_size;


    *table = NULL;

    if ( !idx->offsets )
    {
      error = cff_index_load_offsets( idx );
      if ( error )
        goto Exit;
    }

    new_size = idx->data_size + idx->count;

    if ( idx->count > 0                                &&
         !FT_NEW_ARRAY( t, idx->count + 1 )            &&
         ( !pool || !FT_ALLOC( new_bytes, new_size ) ) )
    {
      FT_ULong  n, cur_offset;
      FT_ULong  extra = 0;
      FT_Byte*  org_bytes = idx->bytes;


      /* at this point, `idx->offsets' can't be NULL */
      cur_offset = idx->offsets[0] - 1;

      /* sanity check */
      if ( cur_offset != 0 )
      {
        FT_TRACE0(( "cff_index_get_pointers:"
                    " invalid first offset value %d set to zero\n",
                    cur_offset ));
        cur_offset = 0;
      }

      if ( !pool )
        t[0] = org_bytes + cur_offset;
      else
        t[0] = new_bytes + cur_offset;

      for ( n = 1; n <= idx->count; n++ )
      {
        FT_ULong  next_offset = idx->offsets[n] - 1;


        /* two sanity checks for invalid offset tables */
        if ( next_offset < cur_offset )
          next_offset = cur_offset;
        else if ( next_offset > idx->data_size )
          next_offset = idx->data_size;

        if ( !pool )
          t[n] = org_bytes + next_offset;
        else
        {
          t[n] = new_bytes + next_offset + extra;

          if ( next_offset != cur_offset )
          {
            FT_MEM_COPY( t[n - 1], org_bytes + cur_offset, t[n] - t[n - 1] );
            t[n][0] = '\0';
            t[n]   += 1;
            extra++;
          }
        }

        cur_offset = next_offset;
      }
      *table = t;

      if ( pool )
        *pool = new_bytes;
      if ( pool_size )
        *pool_size = new_size;
    }

  Exit:
    return error;
  }